

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

bool __thiscall QFormLayout::hasHeightForWidth(QFormLayout *this)

{
  QFormLayoutPrivate *this_00;
  RowWrapPolicy RVar1;
  bool bVar2;
  
  this_00 = *(QFormLayoutPrivate **)&(this->super_QLayout).field_0x8;
  QFormLayoutPrivate::updateSizes(this_00);
  bVar2 = true;
  if ((this_00->field_0xb2 & 3) == 0) {
    RVar1 = rowWrapPolicy(this);
    bVar2 = RVar1 == WrapLongRows;
  }
  return bVar2;
}

Assistant:

bool QFormLayout::hasHeightForWidth() const
{
    Q_D(const QFormLayout);
    QFormLayoutPrivate *e = const_cast<QFormLayoutPrivate *>(d);
    e->updateSizes();
    return (d->has_hfw || rowWrapPolicy() == WrapLongRows);
}